

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O3

state_type __thiscall
estl::state_machine<cdplayer>::next_state
          (state_machine<cdplayer> *this,state_type state,inputs_type *inputs)

{
  state_type sVar1;
  undefined8 *puVar2;
  switch_state_fun fn;
  function<cdplayer::state_type(cdplayer::inputs_type_const&)> local_30 [16];
  code *local_20;
  code *local_18;
  
  std::function<cdplayer::state_type(cdplayer::inputs_type_const&)>::
  function<estl::state_machine<cdplayer>::switch_entry_const&,void>
            (local_30,(this->state_switches_)._M_elems + state);
  if (local_20 != (code *)0x0) {
    sVar1 = (*local_18)(local_30,inputs);
    if (local_20 != (code *)0x0) {
      (*local_20)(local_30,local_30,3);
    }
    return sVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00107d98;
  __cxa_throw(puVar2,&state_not_found::typeinfo,std::exception::~exception);
}

Assistant:

state_type next_state(state_type state, const inputs_type& inputs) const {
        const auto fn = get_switch_state_function(state);
        if (!fn) {
            throw state_not_found{};
        }
        return fn(inputs);
    }